

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.cc
# Opt level: O0

void * operator_new(size_t size)

{
  new_handler p_Var1;
  bad_alloc *this;
  new_handler h;
  void *mem;
  size_t size_local;
  
  mem = (void *)size;
  if (size == 0) {
    mem = (void *)0x1;
  }
  h = (new_handler)malloc((size_t)mem);
  while( true ) {
    if (h != (new_handler)0x0) {
      return h;
    }
    p_Var1 = std::get_new_handler();
    if (p_Var1 == (new_handler)0x0) break;
    (*p_Var1)();
    h = (new_handler)malloc((size_t)mem);
  }
  this = (bad_alloc *)__cxa_allocate_exception(8);
  std::bad_alloc::bad_alloc(this);
  __cxa_throw(this,(type_info *)&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
}

Assistant:

__attribute__((weak))
void* operator new(size_t size) BADALLOC
{
	if (0 == size)
	{
		size = 1;
	}
	void * mem = malloc(size);
	while (0 == mem)
	{
		new_handler h = std::get_new_handler();
		if (0 != h)
		{
			h();
		}
		else
		{
#if !defined(_CXXRT_NO_EXCEPTIONS)
			throw std::bad_alloc();
#else
			break;
#endif
		}
		mem = malloc(size);
	}

	return mem;
}